

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript.h
# Opt level: O2

InputResult * __thiscall
miniscript::Node<XOnlyPubKey>::ProduceInput<TapSatisfier>
          (InputResult *__return_storage_ptr__,Node<XOnlyPubKey> *this,TapSatisfier *ctx)

{
  long in_FS_OFFSET;
  anon_class_8_1_ba1d3d87 helper;
  TapSatisfier *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  local_18 = ctx;
  TreeEval<miniscript::internal::InputResult,miniscript::Node<XOnlyPubKey>::ProduceInput<TapSatisfier>(TapSatisfier_const&)const::_lambda(miniscript::Node<XOnlyPubKey>const&,Span<miniscript::internal::InputResult>)_2_>
            (__return_storage_ptr__,this,(anon_class_8_1_ba1d3d87 *)&local_18);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

internal::InputResult ProduceInput(const Ctx& ctx) const {
        using namespace internal;

        // Internal function which is invoked for every tree node, constructing satisfaction/dissatisfactions
        // given those of its subnodes.
        auto helper = [&ctx](const Node& node, Span<InputResult> subres) -> InputResult {
            switch (node.fragment) {
                case Fragment::PK_K: {
                    std::vector<unsigned char> sig;
                    Availability avail = ctx.Sign(node.keys[0], sig);
                    return {ZERO, InputStack(std::move(sig)).SetWithSig().SetAvailable(avail)};
                }
                case Fragment::PK_H: {
                    std::vector<unsigned char> key = ctx.ToPKBytes(node.keys[0]), sig;
                    Availability avail = ctx.Sign(node.keys[0], sig);
                    return {ZERO + InputStack(key), (InputStack(std::move(sig)).SetWithSig() + InputStack(key)).SetAvailable(avail)};
                }
                case Fragment::MULTI_A: {
                    // sats[j] represents the best stack containing j valid signatures (out of the first i keys).
                    // In the loop below, these stacks are built up using a dynamic programming approach.
                    std::vector<InputStack> sats = Vector(EMPTY);
                    for (size_t i = 0; i < node.keys.size(); ++i) {
                        // Get the signature for the i'th key in reverse order (the signature for the first key needs to
                        // be at the top of the stack, contrary to CHECKMULTISIG's satisfaction).
                        std::vector<unsigned char> sig;
                        Availability avail = ctx.Sign(node.keys[node.keys.size() - 1 - i], sig);
                        // Compute signature stack for just this key.
                        auto sat = InputStack(std::move(sig)).SetWithSig().SetAvailable(avail);
                        // Compute the next sats vector: next_sats[0] is a copy of sats[0] (no signatures). All further
                        // next_sats[j] are equal to either the existing sats[j] + ZERO, or sats[j-1] plus a signature
                        // for the current (i'th) key. The very last element needs all signatures filled.
                        std::vector<InputStack> next_sats;
                        next_sats.push_back(sats[0] + ZERO);
                        for (size_t j = 1; j < sats.size(); ++j) next_sats.push_back((sats[j] + ZERO) | (std::move(sats[j - 1]) + sat));
                        next_sats.push_back(std::move(sats[sats.size() - 1]) + std::move(sat));
                        // Switch over.
                        sats = std::move(next_sats);
                    }
                    // The dissatisfaction consists of as many empty vectors as there are keys, which is the same as
                    // satisfying 0 keys.
                    auto& nsat{sats[0]};
                    assert(node.k != 0);
                    assert(node.k <= sats.size());
                    return {std::move(nsat), std::move(sats[node.k])};
                }
                case Fragment::MULTI: {
                    // sats[j] represents the best stack containing j valid signatures (out of the first i keys).
                    // In the loop below, these stacks are built up using a dynamic programming approach.
                    // sats[0] starts off being {0}, due to the CHECKMULTISIG bug that pops off one element too many.
                    std::vector<InputStack> sats = Vector(ZERO);
                    for (size_t i = 0; i < node.keys.size(); ++i) {
                        std::vector<unsigned char> sig;
                        Availability avail = ctx.Sign(node.keys[i], sig);
                        // Compute signature stack for just the i'th key.
                        auto sat = InputStack(std::move(sig)).SetWithSig().SetAvailable(avail);
                        // Compute the next sats vector: next_sats[0] is a copy of sats[0] (no signatures). All further
                        // next_sats[j] are equal to either the existing sats[j], or sats[j-1] plus a signature for the
                        // current (i'th) key. The very last element needs all signatures filled.
                        std::vector<InputStack> next_sats;
                        next_sats.push_back(sats[0]);
                        for (size_t j = 1; j < sats.size(); ++j) next_sats.push_back(sats[j] | (std::move(sats[j - 1]) + sat));
                        next_sats.push_back(std::move(sats[sats.size() - 1]) + std::move(sat));
                        // Switch over.
                        sats = std::move(next_sats);
                    }
                    // The dissatisfaction consists of k+1 stack elements all equal to 0.
                    InputStack nsat = ZERO;
                    for (size_t i = 0; i < node.k; ++i) nsat = std::move(nsat) + ZERO;
                    assert(node.k <= sats.size());
                    return {std::move(nsat), std::move(sats[node.k])};
                }
                case Fragment::THRESH: {
                    // sats[k] represents the best stack that satisfies k out of the *last* i subexpressions.
                    // In the loop below, these stacks are built up using a dynamic programming approach.
                    // sats[0] starts off empty.
                    std::vector<InputStack> sats = Vector(EMPTY);
                    for (size_t i = 0; i < subres.size(); ++i) {
                        // Introduce an alias for the i'th last satisfaction/dissatisfaction.
                        auto& res = subres[subres.size() - i - 1];
                        // Compute the next sats vector: next_sats[0] is sats[0] plus res.nsat (thus containing all dissatisfactions
                        // so far. next_sats[j] is either sats[j] + res.nsat (reusing j earlier satisfactions) or sats[j-1] + res.sat
                        // (reusing j-1 earlier satisfactions plus a new one). The very last next_sats[j] is all satisfactions.
                        std::vector<InputStack> next_sats;
                        next_sats.push_back(sats[0] + res.nsat);
                        for (size_t j = 1; j < sats.size(); ++j) next_sats.push_back((sats[j] + res.nsat) | (std::move(sats[j - 1]) + res.sat));
                        next_sats.push_back(std::move(sats[sats.size() - 1]) + std::move(res.sat));
                        // Switch over.
                        sats = std::move(next_sats);
                    }
                    // At this point, sats[k].sat is the best satisfaction for the overall thresh() node. The best dissatisfaction
                    // is computed by gathering all sats[i].nsat for i != k.
                    InputStack nsat = INVALID;
                    for (size_t i = 0; i < sats.size(); ++i) {
                        // i==k is the satisfaction; i==0 is the canonical dissatisfaction;
                        // the rest are non-canonical (a no-signature dissatisfaction - the i=0
                        // form - is always available) and malleable (due to overcompleteness).
                        // Marking the solutions malleable here is not strictly necessary, as they
                        // should already never be picked in non-malleable solutions due to the
                        // availability of the i=0 form.
                        if (i != 0 && i != node.k) sats[i].SetMalleable().SetNonCanon();
                        // Include all dissatisfactions (even these non-canonical ones) in nsat.
                        if (i != node.k) nsat = std::move(nsat) | std::move(sats[i]);
                    }
                    assert(node.k <= sats.size());
                    return {std::move(nsat), std::move(sats[node.k])};
                }
                case Fragment::OLDER: {
                    return {INVALID, ctx.CheckOlder(node.k) ? EMPTY : INVALID};
                }
                case Fragment::AFTER: {
                    return {INVALID, ctx.CheckAfter(node.k) ? EMPTY : INVALID};
                }
                case Fragment::SHA256: {
                    std::vector<unsigned char> preimage;
                    Availability avail = ctx.SatSHA256(node.data, preimage);
                    return {ZERO32, InputStack(std::move(preimage)).SetAvailable(avail)};
                }
                case Fragment::RIPEMD160: {
                    std::vector<unsigned char> preimage;
                    Availability avail = ctx.SatRIPEMD160(node.data, preimage);
                    return {ZERO32, InputStack(std::move(preimage)).SetAvailable(avail)};
                }
                case Fragment::HASH256: {
                    std::vector<unsigned char> preimage;
                    Availability avail = ctx.SatHASH256(node.data, preimage);
                    return {ZERO32, InputStack(std::move(preimage)).SetAvailable(avail)};
                }
                case Fragment::HASH160: {
                    std::vector<unsigned char> preimage;
                    Availability avail = ctx.SatHASH160(node.data, preimage);
                    return {ZERO32, InputStack(std::move(preimage)).SetAvailable(avail)};
                }
                case Fragment::AND_V: {
                    auto& x = subres[0], &y = subres[1];
                    // As the dissatisfaction here only consist of a single option, it doesn't
                    // actually need to be listed (it's not required for reasoning about malleability of
                    // other options), and is never required (no valid miniscript relies on the ability
                    // to satisfy the type V left subexpression). It's still listed here for
                    // completeness, as a hypothetical (not currently implemented) satisfier that doesn't
                    // care about malleability might in some cases prefer it still.
                    return {(y.nsat + x.sat).SetNonCanon(), y.sat + x.sat};
                }
                case Fragment::AND_B: {
                    auto& x = subres[0], &y = subres[1];
                    // Note that it is not strictly necessary to mark the 2nd and 3rd dissatisfaction here
                    // as malleable. While they are definitely malleable, they are also non-canonical due
                    // to the guaranteed existence of a no-signature other dissatisfaction (the 1st)
                    // option. Because of that, the 2nd and 3rd option will never be chosen, even if they
                    // weren't marked as malleable.
                    return {(y.nsat + x.nsat) | (y.sat + x.nsat).SetMalleable().SetNonCanon() | (y.nsat + x.sat).SetMalleable().SetNonCanon(), y.sat + x.sat};
                }
                case Fragment::OR_B: {
                    auto& x = subres[0], &z = subres[1];
                    // The (sat(Z) sat(X)) solution is overcomplete (attacker can change either into dsat).
                    return {z.nsat + x.nsat, (z.nsat + x.sat) | (z.sat + x.nsat) | (z.sat + x.sat).SetMalleable().SetNonCanon()};
                }
                case Fragment::OR_C: {
                    auto& x = subres[0], &z = subres[1];
                    return {INVALID, std::move(x.sat) | (z.sat + x.nsat)};
                }
                case Fragment::OR_D: {
                    auto& x = subres[0], &z = subres[1];
                    return {z.nsat + x.nsat, std::move(x.sat) | (z.sat + x.nsat)};
                }
                case Fragment::OR_I: {
                    auto& x = subres[0], &z = subres[1];
                    return {(x.nsat + ONE) | (z.nsat + ZERO), (x.sat + ONE) | (z.sat + ZERO)};
                }
                case Fragment::ANDOR: {
                    auto& x = subres[0], &y = subres[1], &z = subres[2];
                    return {(y.nsat + x.sat).SetNonCanon() | (z.nsat + x.nsat), (y.sat + x.sat) | (z.sat + x.nsat)};
                }
                case Fragment::WRAP_A:
                case Fragment::WRAP_S:
                case Fragment::WRAP_C:
                case Fragment::WRAP_N:
                    return std::move(subres[0]);
                case Fragment::WRAP_D: {
                    auto &x = subres[0];
                    return {ZERO, x.sat + ONE};
                }
                case Fragment::WRAP_J: {
                    auto &x = subres[0];
                    // If a dissatisfaction with a nonzero top stack element exists, an alternative dissatisfaction exists.
                    // As the dissatisfaction logic currently doesn't keep track of this nonzeroness property, and thus even
                    // if a dissatisfaction with a top zero element is found, we don't know whether another one with a
                    // nonzero top stack element exists. Make the conservative assumption that whenever the subexpression is weakly
                    // dissatisfiable, this alternative dissatisfaction exists and leads to malleability.
                    return {InputStack(ZERO).SetMalleable(x.nsat.available != Availability::NO && !x.nsat.has_sig), std::move(x.sat)};
                }
                case Fragment::WRAP_V: {
                    auto &x = subres[0];
                    return {INVALID, std::move(x.sat)};
                }
                case Fragment::JUST_0: return {EMPTY, INVALID};
                case Fragment::JUST_1: return {INVALID, EMPTY};
            }
            assert(false);
            return {INVALID, INVALID};
        };

        auto tester = [&helper](const Node& node, Span<InputResult> subres) -> InputResult {
            auto ret = helper(node, subres);

            // Do a consistency check between the satisfaction code and the type checker
            // (the actual satisfaction code in ProduceInputHelper does not use GetType)

            // For 'z' nodes, available satisfactions/dissatisfactions must have stack size 0.
            if (node.GetType() << "z"_mst && ret.nsat.available != Availability::NO) assert(ret.nsat.stack.size() == 0);
            if (node.GetType() << "z"_mst && ret.sat.available != Availability::NO) assert(ret.sat.stack.size() == 0);

            // For 'o' nodes, available satisfactions/dissatisfactions must have stack size 1.
            if (node.GetType() << "o"_mst && ret.nsat.available != Availability::NO) assert(ret.nsat.stack.size() == 1);
            if (node.GetType() << "o"_mst && ret.sat.available != Availability::NO) assert(ret.sat.stack.size() == 1);

            // For 'n' nodes, available satisfactions/dissatisfactions must have stack size 1 or larger. For satisfactions,
            // the top element cannot be 0.
            if (node.GetType() << "n"_mst && ret.sat.available != Availability::NO) assert(ret.sat.stack.size() >= 1);
            if (node.GetType() << "n"_mst && ret.nsat.available != Availability::NO) assert(ret.nsat.stack.size() >= 1);
            if (node.GetType() << "n"_mst && ret.sat.available != Availability::NO) assert(!ret.sat.stack.back().empty());

            // For 'd' nodes, a dissatisfaction must exist, and they must not need a signature. If it is non-malleable,
            // it must be canonical.
            if (node.GetType() << "d"_mst) assert(ret.nsat.available != Availability::NO);
            if (node.GetType() << "d"_mst) assert(!ret.nsat.has_sig);
            if (node.GetType() << "d"_mst && !ret.nsat.malleable) assert(!ret.nsat.non_canon);

            // For 'f'/'s' nodes, dissatisfactions/satisfactions must have a signature.
            if (node.GetType() << "f"_mst && ret.nsat.available != Availability::NO) assert(ret.nsat.has_sig);
            if (node.GetType() << "s"_mst && ret.sat.available != Availability::NO) assert(ret.sat.has_sig);

            // For non-malleable 'e' nodes, a non-malleable dissatisfaction must exist.
            if (node.GetType() << "me"_mst) assert(ret.nsat.available != Availability::NO);
            if (node.GetType() << "me"_mst) assert(!ret.nsat.malleable);

            // For 'm' nodes, if a satisfaction exists, it must be non-malleable.
            if (node.GetType() << "m"_mst && ret.sat.available != Availability::NO) assert(!ret.sat.malleable);

            // If a non-malleable satisfaction exists, it must be canonical.
            if (ret.sat.available != Availability::NO && !ret.sat.malleable) assert(!ret.sat.non_canon);

            return ret;
        };

        return TreeEval<InputResult>(tester);
    }